

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O0

size_t anon_unknown.dwarf_4bca7::string_startswith(string *s,char *c)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 local_20;
  size_t i;
  char *c_local;
  string *s_local;
  
  local_20 = 0;
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)s);
    bVar3 = false;
    if (*pcVar1 == *c) {
      uVar2 = std::__cxx11::string::length();
      bVar3 = local_20 < uVar2;
    }
    if (!bVar3) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t string_startswith(const std::string & s, const char & c) {
		size_t i(0);
		while (s[i] == c and i < s.length()){
			++i;
		}

		return i;
	}